

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void rgb_rgb_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  JSAMPLE *pJVar7;
  
  switch(cinfo->in_color_space) {
  case JCS_EXT_RGB:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar7 = *input_buf;
      pJVar3 = (*output_buf)[output_row];
      pJVar4 = output_buf[1][output_row];
      pJVar5 = output_buf[2][output_row];
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar3[uVar6] = *pJVar7;
        pJVar4[uVar6] = pJVar7[1];
        pJVar5[uVar6] = pJVar7[2];
        pJVar7 = pJVar7 + 3;
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = *input_buf;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar4[uVar6] = pJVar3[uVar6 * 4];
        pJVar5[uVar6] = pJVar3[uVar6 * 4 + 1];
        pJVar2[uVar6] = pJVar3[uVar6 * 4 + 2];
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_BGR:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*output_buf)[output_row];
      pJVar4 = output_buf[1][output_row];
      pJVar5 = output_buf[2][output_row];
      pJVar7 = *input_buf + 2;
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar3[uVar6] = *pJVar7;
        pJVar4[uVar6] = pJVar7[-1];
        pJVar5[uVar6] = pJVar7[-2];
        pJVar7 = pJVar7 + 3;
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = *input_buf;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar4[uVar6] = pJVar3[uVar6 * 4 + 2];
        pJVar5[uVar6] = pJVar3[uVar6 * 4 + 1];
        pJVar2[uVar6] = pJVar3[uVar6 * 4];
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = *input_buf;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar4[uVar6] = pJVar3[uVar6 * 4 + 3];
        pJVar5[uVar6] = pJVar3[uVar6 * 4 + 2];
        pJVar2[uVar6] = pJVar3[uVar6 * 4 + 1];
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = *input_buf;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar4[uVar6] = pJVar3[uVar6 * 4 + 1];
        pJVar5[uVar6] = pJVar3[uVar6 * 4 + 2];
        pJVar2[uVar6] = pJVar3[uVar6 * 4 + 3];
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  default:
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar7 = *input_buf;
      pJVar3 = (*output_buf)[output_row];
      pJVar4 = output_buf[1][output_row];
      pJVar5 = output_buf[2][output_row];
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pJVar3[uVar6] = *pJVar7;
        pJVar4[uVar6] = pJVar7[1];
        pJVar5[uVar6] = pJVar7[2];
        pJVar7 = pJVar7 + 3;
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  default:
    rgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                             num_rows);
    break;
  }
}